

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::SparseTextureCommitmentTestCase::iterate(SparseTextureCommitmentTestCase *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  byte local_262;
  byte local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  MessageBuilder local_228;
  uint local_a4;
  uint local_a0;
  int l_1;
  int l;
  allocator<char> local_89;
  string local_88 [32];
  uint *local_68;
  GLint *format;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  GLuint texture;
  bool result;
  Functions *gl;
  SparseTextureCommitmentTestCase *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture");
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
    iter._M_current._7_1_ = 1;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
               &local_38);
    while( true ) {
      target = (GLint *)std::vector<int,_std::allocator<int>_>::end(&this->mSupportedTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target);
      if (!bVar1) break;
      formIter._M_current =
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_30);
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedInternalFormats);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
                 &local_58);
      while( true ) {
        format = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                    (&this->mSupportedInternalFormats);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &format);
        if (!bVar1) break;
        local_68 = (uint *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*(&local_50);
        uVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                          (this,(ulong)(uint)*formIter._M_current,(ulong)*local_68);
        if ((uVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
          std::__cxx11::stringstream::str((string *)&this->mLog);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator(&local_89);
          poVar5 = std::operator<<((ostream *)&this->field_0x88,
                                   "Testing sparse texture commitment for target: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*formIter._M_current);
          poVar5 = std::operator<<(poVar5,", format: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_68);
          std::operator<<(poVar5," - ");
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                    (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,3);
          for (local_a0 = 0; (int)local_a0 < (this->mState).levels; local_a0 = local_a0 + 1) {
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                      (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                       (ulong)local_a0);
          }
          for (local_a4 = 0; (int)local_a4 < (this->mState).levels; local_a4 = local_a4 + 1) {
            uVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                               (ulong)local_a4);
            if ((uVar3 & 1) != 0) {
              (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                         (ulong)local_a4);
              iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                                (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter
                                 ,(ulong)local_a4);
              iter._M_current._7_1_ = (byte)iVar2 & 1;
            }
            if ((iter._M_current._7_1_ & 1) == 0) break;
          }
          gl4cts::Texture::Delete(gl_00,(GLuint *)&iter);
          local_261 = 0;
          if ((iter._M_current._7_1_ & 1) != 0) {
            iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter);
            local_261 = (byte)iVar2;
          }
          iter._M_current._7_1_ = local_261 & 1;
          local_262 = 0;
          if (iter._M_current._7_1_ != 0) {
            iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x10])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter);
            local_262 = (byte)iVar2;
          }
          iter._M_current._7_1_ = local_262 & 1;
          if (iter._M_current._7_1_ == 0) {
            this_01 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_228,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            std::__cxx11::stringstream::str();
            pMVar6 = tcu::MessageBuilder::operator<<(&local_228,&local_248);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x2c0b9be);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_248);
            tcu::MessageBuilder::~MessageBuilder(&local_228);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
            return STOP;
          }
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_50);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into not committed region generates no error
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
				writeDataToTexture(gl, target, format, texture, l);

			//Checking if written data into committed region is as expected
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}